

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O1

Loop * __thiscall spvtools::opt::LoopFissionImpl::SplitLoop(LoopFissionImpl *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  undefined4 uVar3;
  Loop *pLVar4;
  mapped_type pBVar5;
  _Base_ptr p_Var6;
  IRContext *this_00;
  mapped_type pIVar7;
  undefined8 *puVar8;
  Function *pFVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  BasicBlock *pBVar12;
  _Hash_node_base *p_Var13;
  mapped_type *ppBVar14;
  _Base_ptr p_Var15;
  mapped_type *pmVar16;
  IRContext *pIVar17;
  mapped_type *ppIVar18;
  _Rb_tree_header *p_Var19;
  Instruction *inst;
  Instruction *pIVar20;
  Instruction *inst_1;
  undefined8 *puVar21;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar22;
  LoopUtils util;
  LoopCloningResult clone_results;
  Instruction *local_188;
  Loop *local_180;
  IRContext *local_178;
  uint32_t local_16c;
  undefined8 *local_168;
  undefined8 *puStack_160;
  long local_158;
  _Hash_node_base *local_150;
  LoopUtils local_148;
  undefined1 local_128 [56];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_80;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  local_48;
  
  local_148.context_ = this->context_;
  pLVar4 = this->loop_;
  local_148.loop_desc_ =
       IRContext::GetLoopDescriptor(local_148.context_,pLVar4->loop_header_->function_);
  local_148.function_ = pLVar4->loop_header_->function_;
  local_128._0_8_ = local_128 + 0x30;
  local_128._8_8_ = 1;
  local_128._16_8_ = (_Hash_node_base *)0x0;
  local_128._24_8_ = 0;
  local_128._32_4_ = 1.0;
  local_128._40_8_ = 0;
  local_128._48_8_ = (__node_base_ptr)0x0;
  local_f0._M_buckets = (__buckets_ptr)(local_128 + 0x68);
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = (__buckets_ptr)(local_128 + 0xa0);
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_80._M_buckets = (__buckets_ptr)(local_128 + 0xd8);
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.loop_ = pLVar4;
  local_180 = LoopUtils::CloneAndAttachLoopToHeader(&local_148,(LoopCloningResult *)local_128);
  Loop::UpdateLoopMergeInst(local_180);
  pFVar9 = local_148.function_;
  pBVar12 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  pIVar20 = (pBVar12->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar10 = 0;
  if (pIVar20->has_result_id_ == true) {
    uVar10 = Instruction::GetSingleWordOperand(pIVar20,(uint)pIVar20->has_type_id_);
  }
  UVar22 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar9->blocks_,
                      (pFVar9->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar9->blocks_,
                      (pFVar9->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,uVar10);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  ::
  _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>>
            ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
              *)&(local_148.function_)->blocks_,UVar22.iterator_._M_current._M_current + 1,
             local_48.
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_48.
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  Loop::SetPreHeaderBlock(this->loop_,local_180->loop_merge_);
  local_168 = (undefined8 *)0x0;
  puStack_160 = (undefined8 *)0x0;
  local_158 = 0;
  p_Var13 = (this->loop_->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    p_Var1 = &(this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &(this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    do {
      uVar3 = *(undefined4 *)&p_Var13[1]._M_nxt;
      pIVar17 = this->context_;
      local_150 = p_Var13;
      if ((pIVar17->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar17);
      }
      local_188 = (Instruction *)CONCAT44(local_188._4_4_,uVar3);
      ppBVar14 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&((pIVar17->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                          id2block_,(key_type *)&local_188);
      pBVar5 = *ppBVar14;
      for (pIVar20 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar20 != &(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar20 = (pIVar20->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        p_Var6 = (this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
        p_Var15 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
            p_Var6 = (&p_Var6->_M_left)[*(Instruction **)(p_Var6 + 1) < pIVar20]) {
          if (*(Instruction **)(p_Var6 + 1) >= pIVar20) {
            p_Var15 = p_Var6;
          }
        }
        p_Var19 = p_Var1;
        if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
           (p_Var19 = (_Rb_tree_header *)p_Var15,
           pIVar20 < (Instruction *)((_Rb_tree_header *)p_Var15)->_M_node_count)) {
          p_Var19 = p_Var1;
        }
        if (p_Var19 != p_Var1) {
          p_Var6 = (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
          p_Var15 = &p_Var2->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(Instruction **)(p_Var6 + 1) < pIVar20]) {
            if (*(Instruction **)(p_Var6 + 1) >= pIVar20) {
              p_Var15 = p_Var6;
            }
          }
          p_Var19 = p_Var2;
          if (((_Rb_tree_header *)p_Var15 != p_Var2) &&
             (p_Var19 = (_Rb_tree_header *)p_Var15,
             pIVar20 < (Instruction *)((_Rb_tree_header *)p_Var15)->_M_node_count)) {
            p_Var19 = p_Var2;
          }
          if ((p_Var19 == p_Var2) &&
             (local_188 = pIVar20,
             std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
             emplace_back<spvtools::opt::Instruction*>
                       ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                         *)&local_168,&local_188), pIVar20->opcode_ == OpPhi)) {
            local_178 = this->context_;
            uVar11 = 0;
            uVar10 = 0;
            if (pIVar20->has_result_id_ == true) {
              uVar10 = Instruction::GetSingleWordOperand(pIVar20,(uint)pIVar20->has_type_id_);
            }
            local_16c = uVar10;
            if (pIVar20->has_result_id_ == true) {
              uVar11 = Instruction::GetSingleWordOperand(pIVar20,(uint)pIVar20->has_type_id_);
            }
            local_188 = (Instruction *)CONCAT44(local_188._4_4_,uVar11);
            pmVar16 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)(local_128 + 0x38),(key_type *)&local_188);
            IRContext::ReplaceAllUsesWith(local_178,local_16c,*pmVar16);
          }
        }
      }
      p_Var13 = local_150->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  pIVar17 = (IRContext *)(local_180->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  puVar21 = local_168;
  puVar8 = puStack_160;
  if (pIVar17 != (IRContext *)0x0) {
    p_Var1 = &(this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &(this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    do {
      uVar3 = (pIVar17->grammar_).target_env_;
      this_00 = this->context_;
      local_178 = pIVar17;
      if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(this_00);
      }
      local_188 = (Instruction *)CONCAT44(local_188._4_4_,uVar3);
      ppBVar14 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&((this_00->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                          id2block_,(key_type *)&local_188);
      pBVar5 = *ppBVar14;
      for (pIVar20 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar20 != &(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar20 = (pIVar20->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        local_188 = pIVar20;
        ppIVar18 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_128,&local_188);
        pIVar7 = *ppIVar18;
        p_Var6 = (this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
        p_Var15 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
            p_Var6 = (&p_Var6->_M_left)[*(mapped_type *)(p_Var6 + 1) < pIVar7]) {
          if (*(mapped_type *)(p_Var6 + 1) >= pIVar7) {
            p_Var15 = p_Var6;
          }
        }
        p_Var19 = p_Var1;
        if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
           (p_Var19 = (_Rb_tree_header *)p_Var15,
           pIVar7 < (mapped_type)((_Rb_tree_header *)p_Var15)->_M_node_count)) {
          p_Var19 = p_Var1;
        }
        if (p_Var19 == p_Var1) {
          p_Var6 = (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
          p_Var15 = &p_Var2->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(mapped_type *)(p_Var6 + 1) < pIVar7]) {
            if (*(mapped_type *)(p_Var6 + 1) >= pIVar7) {
              p_Var15 = p_Var6;
            }
          }
          p_Var19 = p_Var2;
          if (((_Rb_tree_header *)p_Var15 != p_Var2) &&
             (p_Var19 = (_Rb_tree_header *)p_Var15,
             pIVar7 < (mapped_type)((_Rb_tree_header *)p_Var15)->_M_node_count)) {
            p_Var19 = p_Var2;
          }
          if (p_Var19 != p_Var2) {
            local_188 = pIVar20;
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            emplace_back<spvtools::opt::Instruction*>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)&local_168,&local_188);
          }
        }
      }
      pIVar17 = (IRContext *)local_178->syntax_context_;
      puVar21 = local_168;
      puVar8 = puStack_160;
    } while (pIVar17 != (IRContext *)0x0);
  }
  for (; puVar21 != puVar8; puVar21 = puVar21 + 1) {
    IRContext::KillInst(this->context_,(Instruction *)*puVar21);
  }
  if (local_168 != (undefined8 *)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::~vector((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             *)(local_128 + 0xe0));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_128 + 0xa8));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_128 + 0x70));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_128 + 0x38));
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_128);
  return local_180;
}

Assistant:

Loop* LoopFissionImpl::SplitLoop() {
  // Clone the loop.
  LoopUtils util{context_, loop_};
  LoopUtils::LoopCloningResult clone_results;
  Loop* cloned_loop = util.CloneAndAttachLoopToHeader(&clone_results);

  // Update the OpLoopMerge in the cloned loop.
  cloned_loop->UpdateLoopMergeInst();

  // Add the loop_ to the module.
  // TODO(1841): Handle failure to create pre-header.
  Function::iterator it =
      util.GetFunction()->FindBlock(loop_->GetOrCreatePreHeaderBlock()->id());
  util.GetFunction()->AddBasicBlocks(clone_results.cloned_bb_.begin(),
                                     clone_results.cloned_bb_.end(), ++it);
  loop_->SetPreHeaderBlock(cloned_loop->GetMergeBlock());

  std::vector<Instruction*> instructions_to_kill{};

  // Kill all the instructions which should appear in the cloned loop but not in
  // the original loop.
  for (uint32_t id : loop_->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);

    for (Instruction& inst : *block) {
      // If the instruction appears in the cloned loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(&inst) == 1 &&
          original_loop_instructions_.count(&inst) == 0) {
        instructions_to_kill.push_back(&inst);
        if (inst.opcode() == spv::Op::OpPhi) {
          context_->ReplaceAllUsesWith(
              inst.result_id(), clone_results.value_map_[inst.result_id()]);
        }
      }
    }
  }

  // Kill all instructions which should appear in the original loop and not in
  // the cloned loop.
  for (uint32_t id : cloned_loop->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);
    for (Instruction& inst : *block) {
      Instruction* old_inst = clone_results.ptr_map_[&inst];
      // If the instruction belongs to the original loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(old_inst) == 0 &&
          original_loop_instructions_.count(old_inst) == 1) {
        instructions_to_kill.push_back(&inst);
      }
    }
  }

  for (Instruction* i : instructions_to_kill) {
    context_->KillInst(i);
  }

  return cloned_loop;
}